

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

void __thiscall
ThreadedReplayer::resolve_pipeline_library_info
          (ThreadedReplayer *this,VkPipelineLibraryCreateInfoKHR *library,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines)

{
  VkPipeline *ppVVar1;
  const_iterator cVar2;
  VkPipeline pVVar3;
  ulong uVar4;
  VkPipeline local_30;
  
  if (library->libraryCount != 0) {
    ppVVar1 = library->pLibraries;
    uVar4 = 0;
    do {
      local_30 = ppVVar1[uVar4];
      cVar2 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&pipelines->_M_h,(key_type *)&local_30);
      if (cVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        pVVar3 = (VkPipeline)0x0;
      }
      else {
        pVVar3 = *(VkPipeline *)
                  ((long)cVar2.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                         ._M_cur + 0x10);
      }
      ppVVar1[uVar4] = pVVar3;
      uVar4 = uVar4 + 1;
    } while (uVar4 < library->libraryCount);
  }
  return;
}

Assistant:

void resolve_pipeline_library_info(const VkPipelineLibraryCreateInfoKHR &library,
	                                   const unordered_map<Hash, VkPipeline> &pipelines) const
	{
		auto *libs = const_cast<VkPipeline *>(library.pLibraries);
		for (uint32_t i = 0; i < library.libraryCount; i++)
		{
			auto base_itr = pipelines.find((Hash) libs[i]);
			libs[i] = base_itr != end(pipelines) ? base_itr->second : VK_NULL_HANDLE;
		}
	}